

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O1

Error __thiscall asmjit::v1_14::BaseRAPass::runLocalAllocator(BaseRAPass *this)

{
  PhysToWorkMap **targets;
  byte bVar1;
  ArchTraits *pAVar2;
  long lVar3;
  ArchTraits *pAVar4;
  BaseBuilder *pBVar5;
  BaseCompiler *pBVar6;
  FuncNode *pFVar7;
  int iVar8;
  ulong uVar9;
  Error EVar10;
  Error EVar11;
  RegMask *pRVar12;
  ArchTraits *pAVar13;
  long lVar14;
  BaseNode *pBVar15;
  ArchTraits *pAVar16;
  FuncFrame *frame;
  EVP_PKEY_CTX *ctx;
  BaseRAPass *pBVar17;
  uint uVar18;
  BaseRAPass *block;
  uint uVar19;
  ArchTraits *node;
  char cVar20;
  bool bVar21;
  RALocalAllocator lra;
  Error local_16c;
  int local_160;
  BaseRAPass *local_158;
  undefined1 local_130 [80];
  uint local_e0;
  uint local_dc;
  BaseRAPass *local_d0;
  PhysToWorkMap *local_c8;
  BaseRAPass *local_58;
  
  local_130._8_8_ = (this->super_FuncPass).super_Pass._cb;
  local_130._16_8_ = this->_archTraits;
  local_130._24_8_ = *(undefined8 *)(this->_availableRegs)._masks._data;
  local_130._32_8_ = *(undefined8 *)((this->_availableRegs)._masks._data + 2);
  ctx = (EVP_PKEY_CTX *)0x0;
  local_130._0_8_ = this;
  memset(local_130 + 0x28,0,0xd8);
  local_130._56_8_ = *(undefined8 *)(this->_func->_frame)._preservedRegs._data;
  local_130._64_8_ = *(undefined8 *)((this->_func->_frame)._preservedRegs._data + 2);
  pBVar17 = (BaseRAPass *)local_130;
  local_16c = RALocalAllocator::init((RALocalAllocator *)pBVar17,ctx);
  if (local_16c == 0) {
    local_16c = 0;
    if (*(int *)&this->field_0xb8 != 0) {
      block = (BaseRAPass *)**(undefined8 **)&this->_blocks;
      if (((ulong)(block->super_FuncPass).super_Pass._cb & 0x200000000) == 0) {
LAB_0012870c:
        runLocalAllocator();
LAB_00128711:
        runLocalAllocator();
        pBVar6 = (BaseCompiler *)(pBVar17->super_FuncPass).super_Pass._cb;
        pFVar7 = pBVar17->_func;
        (pBVar6->super_BaseBuilder)._cursor = (BaseNode *)pFVar7;
        frame = &pFVar7->_frame;
        EVar11 = BaseEmitter::emitProlog((BaseEmitter *)pBVar6,frame);
        if ((EVar11 == 0) &&
           (EVar11 = BaseEmitHelper::emitArgsAssignment
                               (pBVar17->_iEmitHelper,frame,&pBVar17->_argsAssignment), EVar11 == 0)
           ) {
          pBVar6 = (BaseCompiler *)(pBVar17->super_FuncPass).super_Pass._cb;
          (pBVar6->super_BaseBuilder)._cursor = (BaseNode *)pBVar17->_func->_exitNode;
          EVar11 = BaseEmitter::emitEpilog((BaseEmitter *)pBVar6,frame);
        }
        return EVar11;
      }
      local_160 = *(int *)&this->field_0xd8;
      RALocalAllocator::makeInitialAssignment((RALocalAllocator *)local_130);
      pBVar17 = this;
      local_16c = setBlockEntryAssignment
                            (this,(RABlock *)block,(RABlock *)block,
                             (RAAssignment *)(local_130 + 0x48));
      if (local_16c == 0) {
        uVar19 = 0;
        local_16c = 0;
        do {
          pAVar2 = *(ArchTraits **)(((RARegMask *)&block->_allocator)->_masks)._data;
          uVar18 = *(uint *)((long)&(block->super_FuncPass).super_Pass._cb + 4);
          pAVar13 = pAVar2;
          if ((uVar18 >> 8 & 1) == 0) {
            pAVar13 = (ArchTraits *)0x0;
          }
          targets = (PhysToWorkMap **)&block->field_0x68;
          local_158 = (BaseRAPass *)0x0;
          if (*(int *)((Array<unsigned_int_*,_4UL> *)&block->field_0x70)->_data != 0) {
            local_158 = *(BaseRAPass **)((*targets)->assigned)._masks._data;
          }
          node = (ArchTraits *)(block->super_FuncPass).super_Pass._name;
          lVar3 = *(long *)node;
          pAVar2 = *(ArchTraits **)&pAVar2->_minStackOffset;
          *(uint *)((long)&(block->super_FuncPass).super_Pass._cb + 4) = uVar18 | 8;
          local_58 = block;
          if (node == pAVar2) {
            bVar21 = false;
          }
          else {
            bVar21 = false;
            do {
              pAVar4 = *(ArchTraits **)&node->_minStackOffset;
              if (((node->_instHints)._data[1] & 0x20) == kNoHints) {
                cVar20 = '\0';
                node = pAVar4;
              }
              else {
                pAVar16 = node;
                if (node == pAVar13) {
                  uVar18 = *(uint *)((Array<unsigned_int_*,_4UL> *)&block->field_0x70)->_data;
                  if (((ulong)(block->super_FuncPass).super_Pass._cb & 0x20000000000) == 0) {
                    if (uVar18 < 2) {
                      cVar20 = '\0';
                      bVar21 = true;
                    }
                    else {
                      pBVar17 = (BaseRAPass *)local_130;
                      EVar10 = RALocalAllocator::allocJumpTable
                                         ((RALocalAllocator *)pBVar17,(InstNode *)node,
                                          (RABlocks *)targets,(RABlock *)0x0);
                      EVar11 = EVar10;
                      if (EVar10 == 0) {
                        pAVar16 = pAVar4;
                        EVar11 = local_16c;
                      }
                      local_16c = EVar11;
                      cVar20 = (EVar10 == 0) * '\t' + '\x01';
                    }
                  }
                  else {
                    if (uVar18 == 0) goto LAB_00128711;
                    pBVar17 = (BaseRAPass *)local_130;
                    EVar10 = RALocalAllocator::allocBranch
                                       ((RALocalAllocator *)pBVar17,(InstNode *)node,
                                        *(RABlock **)
                                         (((*targets)->assigned)._masks._data +
                                         (ulong)(uVar18 - 1) * 2),
                                        *(RABlock **)((*targets)->assigned)._masks._data);
                    EVar11 = EVar10;
                    if (EVar10 == 0) {
                      pAVar16 = pAVar4;
                      EVar11 = local_16c;
                    }
                    local_16c = EVar11;
                    cVar20 = (EVar10 == 0) * '\t' + '\x01';
                  }
                  EVar11 = local_16c;
                  if (cVar20 == '\0') goto LAB_00128309;
                }
                else {
LAB_00128309:
                  pBVar17 = (BaseRAPass *)local_130;
                  EVar11 = RALocalAllocator::allocInst((RALocalAllocator *)pBVar17,(InstNode *)node)
                  ;
                  cVar20 = '\x01';
                  if (EVar11 == 0) {
                    if ((node->_instHints)._data[0] == 0x12) {
                      pBVar17 = this;
                      EVar11 = (*(this->super_FuncPass).super_Pass._vptr_Pass[0xe])(this,node);
                    }
                    else {
                      pBVar17 = (BaseRAPass *)local_130;
                      EVar11 = RALocalAllocator::spillAfterAllocation
                                         ((RALocalAllocator *)pBVar17,(InstNode *)node);
                    }
                    if (EVar11 == 0) {
                      cVar20 = '\0';
                      EVar11 = local_16c;
                    }
                  }
                }
                local_16c = EVar11;
                node = pAVar16;
                if (cVar20 == '\0') {
                  node = pAVar4;
                }
              }
              if ((cVar20 != '\n') && (cVar20 != '\0')) goto LAB_0012861d;
            } while (node != pAVar2);
          }
          if (local_158 == (BaseRAPass *)0x0) {
LAB_00128566:
            (block->super_FuncPass).super_Pass._name = (char *)*(ArchTraits **)(lVar3 + 8);
            pAVar13 = (ArchTraits *)&((this->super_FuncPass).super_Pass._cb)->field_0x1a8;
            if (pAVar2 != (ArchTraits *)0x0) {
              pAVar13 = pAVar2;
            }
            *(undefined8 *)(((RARegMask *)&block->_allocator)->_masks)._data =
                 *(undefined8 *)pAVar13;
            local_160 = local_160 + -1;
            if (local_160 == 0) {
              local_160 = 0;
              cVar20 = '\b';
            }
            else if ((local_158 == (BaseRAPass *)0x0) ||
                    (cVar20 = '\t', block = local_158,
                    ((ulong)(local_158->super_FuncPass).super_Pass._cb & 0x800000000) != 0)) {
              uVar18 = *(uint *)&this->field_0xb8;
              uVar19 = uVar19 + 1;
              if (uVar18 <= uVar19) {
                uVar19 = 0;
              }
              if (uVar18 <= uVar19) {
LAB_00128702:
                runLocalAllocator();
                local_158 = pBVar17;
                goto LAB_00128707;
              }
              while ((block = *(BaseRAPass **)(*(long *)&this->_blocks + (ulong)uVar19 * 8),
                     ((ulong)(block->super_FuncPass).super_Pass._cb & 0xa00000000) != 0x200000000 ||
                     (*(PhysToWorkMap **)&block->field_0xc8 == (PhysToWorkMap *)0x0))) {
                uVar19 = uVar19 + 1;
                if (uVar18 <= uVar19) {
                  uVar19 = 0;
                }
              }
              pBVar17 = (BaseRAPass *)local_130;
              RALocalAllocator::replaceAssignment
                        ((RALocalAllocator *)pBVar17,*(PhysToWorkMap **)&block->field_0xc8);
              cVar20 = '\0';
            }
          }
          else {
            pBVar5 = (this->super_FuncPass).super_Pass._cb;
            pAVar13 = (ArchTraits *)&pBVar5->field_0x1a8;
            if (pAVar2 != (ArchTraits *)0x0) {
              pAVar13 = pAVar2;
            }
            pBVar15 = *(BaseNode **)pAVar13;
            if (bVar21) {
              pBVar15 = *(BaseNode **)pBVar15;
            }
            pBVar5->_cursor = pBVar15;
            if (*(PhysToWorkMap **)&local_158->field_0xc8 == (PhysToWorkMap *)0x0) {
              uVar18 = *(uint *)((Array<unsigned_int_*,_4UL> *)&local_158->field_0xb8)->_data;
              if ((ulong)uVar18 == 0xffffffff) {
                pRVar12 = (RegMask *)&local_158->field_0xbc;
LAB_0012850a:
                pBVar17 = (BaseRAPass *)local_130;
                EVar11 = RALocalAllocator::spillScratchGpRegsBeforeEntry
                                   ((RALocalAllocator *)pBVar17,*pRVar12);
                if ((EVar11 == 0) &&
                   (pBVar17 = this,
                   EVar11 = setBlockEntryAssignment
                                      (this,(RABlock *)local_158,(RABlock *)block,
                                       (RAAssignment *)(local_130 + 0x48)), EVar11 == 0)) {
                  memcpy(local_c8,*(void **)&local_158->field_0xc8,(ulong)local_e0 * 4 + 0x20);
                  pBVar17 = local_d0;
                  memset(local_d0,0xff,(ulong)local_dc);
                  lVar14 = 0;
                  do {
                    uVar18 = (local_c8->assigned)._masks._data[lVar14];
                    if (uVar18 != 0) {
                      bVar1 = local_130[lVar14 + 0x48];
                      do {
                        iVar8 = 0;
                        if (uVar18 != 0) {
                          for (; (uVar18 >> iVar8 & 1) == 0; iVar8 = iVar8 + 1) {
                          }
                        }
                        pBVar17 = (BaseRAPass *)(ulong)local_c8->workIds[iVar8 + (uint)bVar1];
                        if (pBVar17 == (BaseRAPass *)0xffffffff) {
                          runLocalAllocator();
                          goto LAB_00128702;
                        }
                        *(char *)((long)&(pBVar17->super_FuncPass).super_Pass._vptr_Pass +
                                 (long)&(local_d0->super_FuncPass).super_Pass._vptr_Pass) =
                             (char)iVar8;
                        uVar18 = uVar18 - 1 & uVar18;
                      } while (uVar18 != 0);
                    }
                    lVar14 = lVar14 + 1;
                  } while (lVar14 != 4);
                  bVar21 = true;
                }
                else {
                  local_16c = EVar11;
                  bVar21 = false;
                }
                goto LAB_00128553;
              }
              pBVar17 = (BaseRAPass *)(local_158->super_FuncPass).super_Pass._vptr_Pass;
              if (uVar18 < *(uint *)&pBVar17->field_0xf0) {
                pRVar12 = (RegMask *)((ulong)uVar18 * 0x20 + *(long *)&pBVar17->_sharedAssignments);
                goto LAB_0012850a;
              }
LAB_00128707:
              runLocalAllocator();
              pBVar17 = local_158;
              goto LAB_0012870c;
            }
            pBVar17 = (BaseRAPass *)local_130;
            EVar11 = RALocalAllocator::switchToAssignment
                               ((RALocalAllocator *)pBVar17,
                                *(PhysToWorkMap **)&local_158->field_0xc8,
                                (ZoneBitVector *)&local_158->_iEmitHelper,
                                SUB41((*(uint *)((long)&(local_158->super_FuncPass).super_Pass._cb +
                                                4) & 8) >> 3,0),false);
            bVar21 = EVar11 == 0;
            if (!bVar21) {
              local_16c = EVar11;
            }
LAB_00128553:
            cVar20 = '\x01';
            if (bVar21) goto LAB_00128566;
          }
LAB_0012861d:
        } while ((cVar20 == '\0') || (cVar20 == '\t'));
        if (cVar20 == '\b') {
          uVar9 = *(ulong *)((this->_clobberedRegs)._masks._data + 2);
          *(ulong *)(this->_clobberedRegs)._masks._data =
               local_130._40_8_ | *(ulong *)(this->_clobberedRegs)._masks._data;
          *(ulong *)((this->_clobberedRegs)._masks._data + 2) = local_130._48_8_ | uVar9;
          local_16c = 0;
        }
      }
    }
  }
  return local_16c;
}

Assistant:

Error BaseRAPass::runLocalAllocator() noexcept {
  RALocalAllocator lra(this);
  ASMJIT_PROPAGATE(lra.init());

  if (!blockCount())
    return kErrorOk;

  // The allocation is done when this reaches zero.
  uint32_t blocksRemaining = reachableBlockCount();

  // Current block.
  uint32_t blockId = 0;
  RABlock* block = _blocks[blockId];

  // The first block (entry) must always be reachable.
  ASMJIT_ASSERT(block->isReachable());

  // Assign function arguments for the initial block. The `lra` is valid now.
  lra.makeInitialAssignment();
  ASMJIT_PROPAGATE(setBlockEntryAssignment(block, block, lra._curAssignment));

  // The loop starts from the first block and iterates blocks in order, however, the algorithm also allows to jump to
  // any other block when finished if it's a jump target. In-order iteration just makes sure that all blocks are visited.
  for (;;) {
    BaseNode* first = block->first();
    BaseNode* last = block->last();
    BaseNode* terminator = block->hasTerminator() ? last : nullptr;

    BaseNode* beforeFirst = first->prev();
    BaseNode* afterLast = last->next();

    bool unconditionalJump = false;
    RABlock* consecutive = nullptr;

    if (block->hasSuccessors())
      consecutive = block->successors()[0];

    lra.setBlock(block);
    block->makeAllocated();

    BaseNode* node = first;
    while (node != afterLast) {
      BaseNode* next = node->next();
      if (node->isInst()) {
        InstNode* inst = node->as<InstNode>();

        if (ASMJIT_UNLIKELY(inst == terminator)) {
          const RABlocks& successors = block->successors();
          if (block->hasConsecutive()) {
            ASMJIT_PROPAGATE(lra.allocBranch(inst, successors.last(), successors.first()));

            node = next;
            continue;
          }
          else if (successors.size() > 1) {
            RABlock* cont = block->hasConsecutive() ? successors.first() : nullptr;
            ASMJIT_PROPAGATE(lra.allocJumpTable(inst, successors, cont));

            node = next;
            continue;
          }
          else {
            // Otherwise this is an unconditional jump, special handling isn't required.
            unconditionalJump = true;
          }
        }

        ASMJIT_PROPAGATE(lra.allocInst(inst));
        if (inst->type() == NodeType::kInvoke)
          ASMJIT_PROPAGATE(emitPreCall(inst->as<InvokeNode>()));
        else
          ASMJIT_PROPAGATE(lra.spillAfterAllocation(inst));
      }
      node = next;
    }

    if (consecutive) {
      BaseNode* prev = afterLast ? afterLast->prev() : cc()->lastNode();
      cc()->_setCursor(unconditionalJump ? prev->prev() : prev);

      if (consecutive->hasEntryAssignment()) {
        ASMJIT_PROPAGATE(lra.switchToAssignment(consecutive->entryPhysToWorkMap(), consecutive->liveIn(), consecutive->isAllocated(), false));
      }
      else {
        ASMJIT_PROPAGATE(lra.spillRegsBeforeEntry(consecutive));
        ASMJIT_PROPAGATE(setBlockEntryAssignment(consecutive, block, lra._curAssignment));
        lra._curAssignment.copyFrom(consecutive->entryPhysToWorkMap());
      }
    }

    // Important as the local allocator can insert instructions before
    // and after any instruction within the basic block.
    block->setFirst(beforeFirst->next());
    block->setLast(afterLast ? afterLast->prev() : cc()->lastNode());

    if (--blocksRemaining == 0)
      break;

    // Switch to the next consecutive block, if any.
    if (consecutive) {
      block = consecutive;
      if (!block->isAllocated())
        continue;
    }

    // Get the next block.
    for (;;) {
      if (++blockId >= blockCount())
        blockId = 0;

      block = _blocks[blockId];
      if (!block->isReachable() || block->isAllocated() || !block->hasEntryAssignment())
        continue;

      break;
    }

    // If we switched to some block we have to update the local allocator.
    lra.replaceAssignment(block->entryPhysToWorkMap());
  }

  _clobberedRegs.op<Support::Or>(lra._clobberedRegs);
  return kErrorOk;
}